

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O1

int cvNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector delta,sunrealtype tol,N_Vector ewt,
                 void *cvode_mem)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  int m;
  int local_3c;
  double local_38;
  sunrealtype local_30;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x140,"cvNlsConvTest",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    local_30 = tol;
    local_38 = (double)N_VWrmsNorm(delta,ewt);
    iVar1 = SUNNonlinSolGetCurIter(NLS,&local_3c);
    iVar2 = -0x15;
    if (iVar1 == 0) {
      if (0 < local_3c) {
        dVar4 = *(double *)((long)cvode_mem + 0x2a0) * 0.3;
        dVar3 = local_38 / *(double *)((long)cvode_mem + 0x2a8);
        if (dVar4 <= dVar3) {
          dVar4 = dVar3;
        }
        *(double *)((long)cvode_mem + 0x2a0) = dVar4;
      }
      dVar4 = 1.0;
      if (*(double *)((long)cvode_mem + 0x2a0) <= 1.0) {
        dVar4 = *(double *)((long)cvode_mem + 0x2a0);
      }
      if ((dVar4 * local_38) / local_30 <= 1.0) {
        if (local_3c != 0) {
          local_38 = (double)N_VWrmsNorm(ycor,ewt);
        }
        *(double *)((long)cvode_mem + 0x2b0) = local_38;
        *(undefined4 *)((long)cvode_mem + 0x2b8) = 1;
        iVar2 = 0;
      }
      else if ((local_3c < 1) ||
              (iVar2 = 0x386,
              local_38 <=
              *(double *)((long)cvode_mem + 0x2a8) + *(double *)((long)cvode_mem + 0x2a8))) {
        *(double *)((long)cvode_mem + 0x2a8) = local_38;
        iVar2 = 0x385;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsConvTest(SUNNonlinearSolver NLS, N_Vector ycor, N_Vector delta,
                         sunrealtype tol, N_Vector ewt, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype del;
  sunrealtype dcon;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* compute the norm of the correction */
  del = N_VWrmsNorm(delta, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.        */
  if (m > 0)
  {
    cv_mem->cv_crate = SUNMAX(CRDOWN * cv_mem->cv_crate, del / cv_mem->cv_delp);
  }
  dcon = del * SUNMIN(ONE, cv_mem->cv_crate) / tol;

  if (dcon <= ONE)
  {
    cv_mem->cv_acnrm    = (m == 0) ? del : N_VWrmsNorm(ycor, ewt);
    cv_mem->cv_acnrmcur = SUNTRUE;
    return (CV_SUCCESS); /* Nonlinear system was solved successfully */
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}